

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O2

int mg_match_prefix(char *pattern,int pattern_len,char *str)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  void *pvVar6;
  long lVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  size_t sVar7;
  
  uVar10 = (ulong)(uint)pattern_len;
  while( true ) {
    iVar9 = (int)uVar10;
    pvVar6 = memchr(pattern,0x7c,(long)iVar9);
    if (pvVar6 == (void *)0x0) break;
    iVar11 = (int)pattern;
    uVar2 = mg_match_prefix(pattern,(int)pvVar6 - iVar11,str);
    if (0 < (int)uVar2) goto LAB_0010edc8;
    pattern = (char *)((long)pvVar6 + 1);
    uVar10 = (ulong)(uint)((iVar11 + iVar9) - (int)pattern);
  }
  uVar13 = 0;
  uVar14 = 0;
  if (0 < iVar9) {
    uVar14 = uVar10;
  }
  for (; uVar14 != uVar13; uVar13 = uVar13 + 1) {
    cVar1 = pattern[uVar13];
    if (cVar1 == '?') {
      if (str[uVar13] == '\0') goto LAB_0010eda6;
    }
    else {
      uVar2 = (uint)uVar13;
      if (cVar1 == '$') {
        uVar14 = (ulong)(-(uint)(str[uVar13] != '\0') | uVar2);
        break;
      }
      if (cVar1 == '*') {
        if (pattern[uVar13 + 1] == '*') {
          iVar11 = uVar2 + 2;
          sVar7 = strlen(str + uVar13);
          uVar3 = (uint)sVar7;
        }
        else {
          iVar11 = uVar2 + 1;
          sVar7 = strcspn(str + uVar13,"/");
          uVar3 = (uint)sVar7;
        }
        if (iVar11 != iVar9) {
          iVar4 = ((int)uVar3 >> 0x1f & uVar3) - 1;
          lVar12 = 0;
          goto LAB_0010ee4e;
        }
        uVar14 = (ulong)(uVar3 + uVar2);
        break;
      }
LAB_0010eda6:
      iVar11 = lowercase(pattern + uVar13);
      iVar4 = lowercase(str + uVar13);
      if (iVar11 != iVar4) {
        uVar2 = 0xffffffff;
LAB_0010edc8:
        uVar14 = (ulong)uVar2;
        break;
      }
    }
  }
  goto LAB_0010edcb;
  while (lVar8 = (long)(int)uVar3 + 1 + lVar12, lVar12 = lVar12 + -1, lVar8 != 1 && -1 < lVar8 + -1)
  {
LAB_0010ee4e:
    iVar5 = mg_match_prefix(pattern + iVar11,iVar9 - iVar11,str + lVar12 + (long)(int)uVar3 + uVar13
                           );
    if (iVar5 != -1) {
      iVar4 = uVar3 + (int)lVar12;
      break;
    }
  }
  uVar2 = uVar2 + iVar4 + iVar5;
  if (iVar5 == -1) {
    uVar2 = 0xffffffff;
  }
  uVar14 = (ulong)uVar2;
LAB_0010edcb:
  return (int)uVar14;
}

Assistant:

int mg_match_prefix(const char *pattern, int pattern_len, const char *str) {
    const char *or_str;
    int len, res, i = 0, j = 0;

    if ((or_str = (const char *) memchr(pattern, '|', pattern_len)) != NULL) {
        res = mg_match_prefix(pattern, or_str - pattern, str);
        return res > 0 ? res : mg_match_prefix(
                or_str + 1,
                (pattern + pattern_len) - (or_str + 1), str);
    }

    for (; i < pattern_len; i++, j++) {
        if (pattern[i] == '?' && str[j] != '\0') {
            continue;
        } else if (pattern[i] == '$') {
            return str[j] == '\0' ? j : -1;
        } else if (pattern[i] == '*') {
            i++;
            if (pattern[i] == '*') {
                i++;
                len = (int) strlen(str + j);
            } else {
                len = (int) strcspn(str + j, "/");
            }
            if (i == pattern_len) {
                return j + len;
            }
            do {
                res = mg_match_prefix(pattern + i, pattern_len - i, str + j + len);
            } while (res == -1 && len-- > 0);
            return res == -1 ? -1 : j + res + len;
        } else if (lowercase(&pattern[i]) != lowercase(&str[j])) {
            return -1;
        }
    }
    return j;
}